

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::DebuggerScope::GetSiblingScope(DebuggerScope *this,RegSlot location,FunctionBody *functionBody)

{
  code *pcVar1;
  DiagExtraScopesType scopeType;
  int start;
  undefined4 *puVar2;
  DebuggerScope **ppDVar3;
  DebuggerScope *ptr;
  bool bVar4;
  bool bVar5;
  bool isCatchSlotOrObject;
  bool isBlockSlotOrObject;
  FunctionBody *functionBody_local;
  RegSlot location_local;
  DebuggerScope *this_local;
  
  bVar4 = true;
  if (this->scopeType != DiagBlockScopeInSlot) {
    bVar4 = this->scopeType == DiagBlockScopeInObject;
  }
  bVar5 = true;
  if (this->scopeType != DiagCatchScopeInSlot) {
    bVar5 = this->scopeType == DiagCatchScopeInObject;
  }
  if ((!bVar4) && (!bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar2 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x165a,"(isBlockSlotOrObject || isCatchSlotOrObject)",
                                "isBlockSlotOrObject || isCatchSlotOrObject");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar2 = 0;
  }
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__
                      ((WriteBarrierPtr *)&this->siblingScope);
  if (*ppDVar3 == (DebuggerScope *)0x0) {
    scopeType = DiagCatchScopeDirect;
    if (bVar4) {
      scopeType = DiagBlockScopeDirect;
    }
    start = GetStart(this);
    ptr = FunctionBody::RecordStartScopeObject(functionBody,scopeType,start,location,(int *)0x0);
    Memory::WriteBarrierPtr<Js::DebuggerScope>::operator=(&this->siblingScope,ptr);
  }
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__
                      ((WriteBarrierPtr *)&this->siblingScope);
  return *ppDVar3;
}

Assistant:

DebuggerScope * DebuggerScope::GetSiblingScope(RegSlot location, FunctionBody *functionBody)
    {
        bool isBlockSlotOrObject = scopeType == Js::DiagExtraScopesType::DiagBlockScopeInSlot || scopeType == Js::DiagExtraScopesType::DiagBlockScopeInObject;
        bool isCatchSlotOrObject = scopeType == Js::DiagExtraScopesType::DiagCatchScopeInSlot || scopeType == Js::DiagExtraScopesType::DiagCatchScopeInObject;

        // This is expected to be called only when the current scope is either slot or activation object.
        Assert(isBlockSlotOrObject || isCatchSlotOrObject);

        if (siblingScope == nullptr)
        {
            // If the sibling isn't there, attempt to retrieve it if we're reparsing or create it anew if this is the first parse.
            siblingScope = functionBody->RecordStartScopeObject(isBlockSlotOrObject ? Js::DiagExtraScopesType::DiagBlockScopeDirect : Js::DiagExtraScopesType::DiagCatchScopeDirect, GetStart(), location);
        }

        return siblingScope;
    }